

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUploadHandler.cxx
# Opt level: O0

int __thiscall cmCTestUploadHandler::ProcessHandler(cmCTestUploadHandler *this)

{
  cmCTest *pcVar1;
  bool bVar2;
  char *pcVar3;
  reference value;
  ostream *poVar4;
  string local_8f0;
  allocator<char> local_8c9;
  string local_8c8;
  allocator<char> local_8a1;
  string local_8a0;
  string local_880 [32];
  undefined1 local_860 [8];
  ostringstream cmCTestLog_msg_1;
  string *file;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  allocator<char> local_621;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  allocator<char> local_559;
  string local_558;
  undefined1 local_538 [8];
  cmXMLWriter xml;
  string local_4d8;
  string local_4b8;
  undefined1 local_498 [8];
  string buildname;
  string local_470 [32];
  undefined1 local_450 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_2d1;
  string local_2d0;
  string local_2a0;
  undefined1 local_280 [8];
  cmGeneratedFileStream ofs;
  cmCTestUploadHandler *this_local;
  
  ofs._608_8_ = this;
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_280,None);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  cmCTest::GetCurrentTag_abi_cxx11_(&local_2a0,pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"Upload.xml",&local_2d1);
  bVar2 = cmCTest::OpenOutputFile
                    (pcVar1,&local_2a0,&local_2d0,(cmGeneratedFileStream *)local_280,false);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string((string *)&local_2a0);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,"BuildName",(allocator<char> *)&xml.field_0x57);
    cmCTest::GetCTestConfiguration(&local_4b8,pcVar1,&local_4d8);
    cmCTest::SafeBuildIdField((string *)local_498,&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator((allocator<char> *)&xml.field_0x57);
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_538,(ostream *)local_280,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_538,"UTF-8");
    cmXMLWriter::ProcessingInstruction
              ((cmXMLWriter *)local_538,"xml-stylesheet",
               "type=\"text/xsl\" href=\"Dart/Source/Server/XSL/Build.xsl <file:///Dart/Source/Server/XSL/Build.xsl> \""
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"Site",&local_559);
    cmXMLWriter::StartElement((cmXMLWriter *)local_538,&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::~allocator(&local_559);
    cmXMLWriter::Attribute<std::__cxx11::string>
              ((cmXMLWriter *)local_538,"BuildName",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498);
    cmCTest::GetCurrentTag_abi_cxx11_(&local_5c0,(this->super_cmCTestGenericHandler).CTest);
    std::operator+(&local_5a0,&local_5c0,"-");
    cmCTest::GetTestModelString_abi_cxx11_(&local_5e0,(this->super_cmCTestGenericHandler).CTest);
    std::operator+(&local_580,&local_5a0,&local_5e0);
    cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_538,"BuildStamp",&local_580);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_5c0);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"Site",&local_621);
    cmCTest::GetCTestConfiguration(&local_600,pcVar1,&local_620);
    cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_538,"Name",&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator(&local_621);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"ctest-",&local_669);
    pcVar3 = cmVersion::GetCMakeVersion();
    std::operator+(&local_648,&local_668,pcVar3);
    cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_538,"Generator",&local_648);
    std::__cxx11::string::~string((string *)&local_648);
    std::__cxx11::string::~string((string *)&local_668);
    std::allocator<char>::~allocator(&local_669);
    cmCTest::AddSiteProperties((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_538);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"Upload",&local_691);
    cmXMLWriter::StartElement((cmXMLWriter *)local_538,&local_690);
    std::__cxx11::string::~string((string *)&local_690);
    std::allocator<char>::~allocator(&local_691);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"Time",&local_6b9);
    __range1 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)std::chrono::_V2::system_clock::now();
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              ((cmXMLWriter *)local_538,&local_6b8,
               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&__range1);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::allocator<char>::~allocator(&local_6b9);
    __end1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->Files);
    file = (string *)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->Files);
    while( true ) {
      bVar2 = std::operator!=(&__end1,(_Self *)&file);
      if (!bVar2) break;
      value = std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&__end1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_860);
      poVar4 = std::operator<<((ostream *)local_860,"\tUpload file: ");
      poVar4 = std::operator<<(poVar4,(string *)value);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUploadHandler.cxx"
                   ,0x3e,pcVar3,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_880);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_860);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"File",&local_8a1);
      cmXMLWriter::StartElement((cmXMLWriter *)local_538,&local_8a0);
      std::__cxx11::string::~string((string *)&local_8a0);
      std::allocator<char>::~allocator(&local_8a1);
      cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_538,"filename",value);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c8,"Content",&local_8c9);
      cmXMLWriter::StartElement((cmXMLWriter *)local_538,&local_8c8);
      std::__cxx11::string::~string((string *)&local_8c8);
      std::allocator<char>::~allocator(&local_8c9);
      cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_538,"encoding",(char (*) [7])"base64");
      cmCTest::Base64EncodeFile(&local_8f0,(this->super_cmCTestGenericHandler).CTest,value);
      cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_538,&local_8f0);
      std::__cxx11::string::~string((string *)&local_8f0);
      cmXMLWriter::EndElement((cmXMLWriter *)local_538);
      cmXMLWriter::EndElement((cmXMLWriter *)local_538);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_538);
    cmXMLWriter::EndElement((cmXMLWriter *)local_538);
    cmXMLWriter::EndDocument((cmXMLWriter *)local_538);
    this_local._4_4_ = 0;
    buildname.field_2._12_4_ = 1;
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_538);
    std::__cxx11::string::~string((string *)local_498);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_450);
    poVar4 = std::operator<<((ostream *)local_450,"Cannot open Upload.xml file");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestUploadHandler.cxx"
                 ,0x24,pcVar3,false);
    std::__cxx11::string::~string(local_470);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_450);
    this_local._4_4_ = -1;
    buildname.field_2._12_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_280);
  return this_local._4_4_;
}

Assistant:

int cmCTestUploadHandler::ProcessHandler()
{
  cmGeneratedFileStream ofs;
  if (!this->CTest->OpenOutputFile(this->CTest->GetCurrentTag(), "Upload.xml",
                                   ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open Upload.xml file" << std::endl);
    return -1;
  }
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));

  cmXMLWriter xml(ofs);
  xml.StartDocument();
  xml.ProcessingInstruction("xml-stylesheet",
                            "type=\"text/xsl\" "
                            "href=\"Dart/Source/Server/XSL/Build.xsl "
                            "<file:///Dart/Source/Server/XSL/Build.xsl> \"");
  xml.StartElement("Site");
  xml.Attribute("BuildName", buildname);
  xml.Attribute("BuildStamp",
                this->CTest->GetCurrentTag() + "-" +
                  this->CTest->GetTestModelString());
  xml.Attribute("Name", this->CTest->GetCTestConfiguration("Site"));
  xml.Attribute("Generator",
                std::string("ctest-") + cmVersion::GetCMakeVersion());
  this->CTest->AddSiteProperties(xml);
  xml.StartElement("Upload");
  xml.Element("Time", std::chrono::system_clock::now());

  for (std::string const& file : this->Files) {
    cmCTestOptionalLog(this->CTest, OUTPUT,
                       "\tUpload file: " << file << std::endl, this->Quiet);
    xml.StartElement("File");
    xml.Attribute("filename", file);
    xml.StartElement("Content");
    xml.Attribute("encoding", "base64");
    xml.Content(this->CTest->Base64EncodeFile(file));
    xml.EndElement(); // Content
    xml.EndElement(); // File
  }
  xml.EndElement(); // Upload
  xml.EndElement(); // Site
  xml.EndDocument();
  return 0;
}